

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBreak * AnalyzeBreak(ExpressionContext *ctx,SynBreak *syntax)

{
  SynNumber *source;
  TypeBase *pTVar1;
  ScopeData *pSVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  FunctionData *onwerFunction;
  char *msg;
  uint depth;
  ExprBreak *pEVar5;
  
  if (syntax->number == (SynNumber *)0x0) {
    depth = 1;
  }
  else {
    pEVar4 = AnalyzeExpression(ctx,&syntax->number->super_SynBase);
    source = syntax->number;
    pEVar4 = CreateCast(ctx,&source->super_SynBase,pEVar4,ctx->typeLong,false);
    pEVar4 = anon_unknown.dwarf_c6b42::EvaluateExpression(ctx,&source->super_SynBase,pEVar4);
    if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 6)) {
      pEVar4 = (ExprBase *)0x0;
    }
    if (pEVar4 == (ExprBase *)0x0) {
      syntax = (SynBreak *)syntax->number;
      msg = "ERROR: break statement must be followed by \';\' or a constant";
      goto LAB_001864d3;
    }
    if ((long)pEVar4[1]._vptr_ExprBase < 1) {
      syntax = (SynBreak *)syntax->number;
      msg = "ERROR: break level can\'t be negative or zero";
      goto LAB_001864d3;
    }
    depth = *(uint *)&pEVar4[1]._vptr_ExprBase;
  }
  if (depth <= ctx->scope->breakDepth) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar5 = (ExprBreak *)CONCAT44(extraout_var,iVar3);
    pTVar1 = ctx->typeVoid;
    for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0))
        ; pSVar2 = pSVar2->scope) {
      onwerFunction = pSVar2->ownerFunction;
      if (onwerFunction != (FunctionData *)0x0) goto LAB_00186460;
    }
    onwerFunction = (FunctionData *)0x0;
LAB_00186460:
    pEVar4 = CreateBreakUpvalueClose(ctx,&syntax->super_SynBase,onwerFunction,ctx->scope,depth);
    (pEVar5->super_ExprBase).typeID = 0x34;
    (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002493b0;
    *(uint *)&(pEVar5->super_ExprBase).field_0x2c = depth;
    pEVar5->closures = pEVar4;
    return pEVar5;
  }
  msg = "ERROR: break level is greater that loop depth";
LAB_001864d3:
  anon_unknown.dwarf_c6b42::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBreak* AnalyzeBreak(ExpressionContext &ctx, SynBreak *syntax)
{
	unsigned depth = 1;

	if(syntax->number)
	{
		ExprBase *numberValue = AnalyzeExpression(ctx, syntax->number);

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax->number, CreateCast(ctx, syntax->number, numberValue, ctx.typeLong, false))))
		{
			if(number->value <= 0)
				Stop(ctx, syntax->number, "ERROR: break level can't be negative or zero");

			depth = unsigned(number->value);
		}
		else
		{
			Stop(ctx, syntax->number, "ERROR: break statement must be followed by ';' or a constant");
		}
	}

	if(ctx.scope->breakDepth < depth)
		Stop(ctx, syntax, "ERROR: break level is greater that loop depth");

	return new (ctx.get<ExprBreak>()) ExprBreak(syntax, ctx.typeVoid, depth, CreateBreakUpvalueClose(ctx, syntax, ctx.GetCurrentFunction(ctx.scope), ctx.scope, depth));
}